

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O0

void __thiscall
Logger<(Log)0>::createMessage<std::__cxx11::string&>
          (Logger<(Log)0> *this,stringstream *msg,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg)

{
  char cVar1;
  bool bVar2;
  string *in_RCX;
  char *in_RDX;
  long in_RSI;
  bool doSkipNext;
  bool local_21;
  char *local_18;
  
  local_21 = false;
  local_18 = in_RDX;
  while( true ) {
    bVar2 = false;
    if (*local_18 != '%') {
      bVar2 = (bool)(local_21 ^ 1);
    }
    if (!bVar2) break;
    if (*local_18 == '\0') {
      return;
    }
    cVar1 = *local_18;
    if (cVar1 != '\\') {
      std::operator<<((ostream *)(in_RSI + 0x10),*local_18);
      local_18 = local_18 + 1;
    }
    local_21 = cVar1 == '\\';
  }
  std::operator<<((ostream *)(in_RSI + 0x10),in_RCX);
  while (local_18 = local_18 + 1, *local_18 != '\0') {
    std::operator<<((ostream *)(in_RSI + 0x10),*local_18);
  }
  return;
}

Assistant:

void createMessage(std::stringstream& msg, const char* fmt, Arg1&& arg)
     {
       bool doSkipNext = false;
       while (*fmt != '%' && !doSkipNext)
       {
         doSkipNext = false;
         if (*fmt == '\0') // End of string
           return;
         
         if (*fmt == '\\')
         { //Escape for the %sign
           doSkipNext = true;
         }
         else 
         { //invoke the replacement
           msg << *fmt;
           fmt++;
         }
       }
       fmt++; //Consume the % sign
       msg << arg;
       while (*fmt != '\0')
       { //And print the end of the message!
         msg << *fmt;
         fmt++;
       }
     }